

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
fasttext::Dictionary::getSubwords(Dictionary *this,string *word)

{
  string_view w;
  bool bVar1;
  int32_t iVar2;
  string *in_RDX;
  Dictionary *in_RSI;
  Dictionary *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  string *in_stack_00000018;
  Dictionary *in_stack_00000020;
  int32_t i;
  vector<int,_std::allocator<int>_> *ngrams;
  undefined4 in_stack_ffffffffffffff58;
  int32_t in_stack_ffffffffffffff5c;
  Dictionary *__lhs;
  size_t in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  
  __lhs = in_RDI;
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RDX);
  w._M_str = (char *)in_stack_ffffffffffffff80;
  w._M_len = in_stack_ffffffffffffff78;
  iVar2 = getId(in_RSI,w);
  if (iVar2 < 0) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a78cd);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
    ;
    if (bVar1) {
      std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      computeSubwords(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
    }
  }
  else {
    getSubwords(in_RDI,in_stack_ffffffffffffff5c);
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return (vector<int,_std::allocator<int>_> *)__lhs;
}

Assistant:

const std::vector<int32_t> Dictionary::getSubwords(
    const std::string& word) const {
  int32_t i = getId(word);
  if (i >= 0) {
    return getSubwords(i);
  }
  std::vector<int32_t> ngrams;
  if (word != EOS) {
    computeSubwords(BOW + word + EOW, ngrams);
  }
  return ngrams;
}